

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O0

float webrtc::GetMinimumSpacing
                (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 *array_geometry)

{
  CartesianPoint<float> a;
  ulong uVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  float *pfVar5;
  float local_1c4;
  ulong local_1c0;
  size_t j;
  size_t i;
  float mic_spacing;
  FatalMessage local_1a0;
  uint local_24;
  size_type local_20;
  string *local_18;
  string *_result;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  *array_geometry_local;
  
  _result = (string *)array_geometry;
  local_20 = std::
             vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             ::size(array_geometry);
  local_24 = 1;
  local_18 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       (&local_20,&local_24,"array_geometry.size() > 1u");
  if (local_18 == (string *)0x0) {
    i._0_4_ = std::numeric_limits<float>::max();
    for (j = 0; sVar2 = j,
        sVar3 = std::
                vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                ::size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                        *)_result), local_1c0 = j, sVar2 < sVar3 - 1; j = j + 1) {
      while( true ) {
        local_1c0 = local_1c0 + 1;
        uVar1 = local_1c0;
        sVar3 = std::
                vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                ::size((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                        *)_result);
        if (sVar3 <= uVar1) break;
        pvVar4 = std::
                 vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                               *)_result,j);
        a.c = *&pvVar4->c;
        pvVar4 = std::
                 vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                 ::operator[]((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                               *)_result,local_1c0);
        local_1c4 = Distance<float>(a,(CartesianPoint<float>)*&pvVar4->c);
        pfVar5 = std::min<float>((float *)&i,&local_1c4);
        i._0_4_ = *pfVar5;
      }
    }
    return (float)i;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/array_util.cc"
             ,0x1a,local_18);
  rtc::FatalMessage::stream(&local_1a0);
  rtc::FatalMessage::~FatalMessage(&local_1a0);
}

Assistant:

float GetMinimumSpacing(const std::vector<Point>& array_geometry) {
  RTC_CHECK_GT(array_geometry.size(), 1u);
  float mic_spacing = std::numeric_limits<float>::max();
  for (size_t i = 0; i < (array_geometry.size() - 1); ++i) {
    for (size_t j = i + 1; j < array_geometry.size(); ++j) {
      mic_spacing =
          std::min(mic_spacing, Distance(array_geometry[i], array_geometry[j]));
    }
  }
  return mic_spacing;
}